

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_if_suite.cpp
# Opt level: O0

void find_u32string(void)

{
  bool bVar1;
  iterator local_180;
  iterator local_160;
  iterator local_148;
  iterator local_130;
  iterator local_118;
  iterator local_f8;
  iterator local_e0;
  iterator local_c8;
  iterator local_b0;
  iterator local_90;
  iterator local_68;
  iterator local_50;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_68,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_90,(basic_variable<std::allocator<char>_> *)local_38);
  std::find_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,find_u32string()::__0>
            (&local_50,&local_68,&local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_b0,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    (&local_50,&local_b0);
  boost::detail::test_impl
            ("std::find_if(data.begin(), data.end(), [] (const variable& value) { return value == U\"\"; }) == data.end()"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_if_suite.cpp"
             ,0x61,"void find_u32string()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_e0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_f8,(basic_variable<std::allocator<char>_> *)local_38);
  std::find_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,find_u32string()::__1>
            (&local_c8,&local_e0,&local_f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_118,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    (&local_c8,&local_118);
  boost::detail::test_impl
            ("std::find_if(data.begin(), data.end(), [] (const variable& value) { return value == U\"zulu\"; }) == data.end()"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_if_suite.cpp"
             ,99,"void find_u32string()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_148,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_160,(basic_variable<std::allocator<char>_> *)local_38);
  std::find_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,find_u32string()::__2>
            (&local_130,&local_148,&local_160);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_180,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    (&local_130,&local_180);
  boost::detail::test_impl
            ("std::find_if(data.begin(), data.end(), [] (const variable& value) { return value == U\"delta\"; }) != data.end()"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_if_suite.cpp"
             ,0x65,"void find_u32string()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_180);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_130);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_160);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_148);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void find_u32string()
{
    variable data(U"delta");
    TRIAL_PROTOCOL_TEST(std::find_if(data.begin(), data.end(),
                                     [] (const variable& value) { return value == U""; }) == data.end());
    TRIAL_PROTOCOL_TEST(std::find_if(data.begin(), data.end(),
                                     [] (const variable& value) { return value == U"zulu"; }) == data.end());
    TRIAL_PROTOCOL_TEST(std::find_if(data.begin(), data.end(),
                                     [] (const variable& value) { return value == U"delta"; }) != data.end());
}